

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_mp_from_hex(void)

{
  uint32_t uVar1;
  size_t sVar2;
  mp_int *x_00;
  ptrlen hex_00;
  mp_int *x;
  size_t sStack_58;
  uint8_t r [4];
  size_t j;
  size_t i;
  char hex [64];
  
  j = 0;
  while( true ) {
    sVar2 = (*looplimit)(8);
    if (sVar2 <= j) break;
    memset(&i,0x30,0x40);
    for (sStack_58 = test_mp_from_hex::starts[j]; sStack_58 < 0x40; sStack_58 = sStack_58 + 1) {
      random_read((void *)((long)&x + 4),4);
      uVar1 = GET_32BIT_MSB_FIRST((void *)((long)&x + 4));
      hex[sStack_58 - 8] = "0123456789abcdefABCDEF"[(ulong)uVar1 % 0x17];
    }
    log_start();
    hex_00 = make_ptrlen(&i,0x40);
    x_00 = mp_from_hex_pl(hex_00);
    log_end();
    mp_free(x_00);
    j = j + 1;
  }
  return;
}

Assistant:

static void test_mp_from_hex(void)
{
    char hex[64];
    static const size_t starts[] = { 0, 1, 5, 16, 23, 32, 63, 64 };
    static const char digits[] = "0123456789abcdefABCDEF";
    for (size_t i = 0; i < looplimit(lenof(starts)); i++) {
        memset(hex, '0', lenof(hex));
        for (size_t j = starts[i]; j < lenof(hex); j++) {
            uint8_t r[4];
            random_read(r, 4);
            hex[j] = digits[GET_32BIT_MSB_FIRST(r) % lenof(digits)];
        }
        log_start();
        mp_int *x = mp_from_hex_pl(make_ptrlen(hex, lenof(hex)));
        log_end();
        mp_free(x);
    }
}